

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_strcspn.c
# Opt level: O2

int main2(void)

{
  return 0;
}

Assistant:

int main2() {
    const char a[] = "abcd1efgh2i";
    const char b[] = "123";
    const char c[] = "890";

    ASSERT_INT_EQ(strcspn(a, "123"), 4);
    ASSERT_INT_EQ(strcspn(a, "abc"), 0);
    ASSERT_INT_EQ(strcspn(a, "890"), strlen(a));

    return 0;
}